

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderImageLoadStoreTests.cpp
# Opt level: O0

string * __thiscall
glcts::anon_unknown_0::AtomicMachine::GenShader<unsigned_int>
          (string *__return_storage_ptr__,AtomicMachine *this,int target,int stage,
          GLenum internalformat)

{
  ostream *poVar1;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  undefined1 local_1a0 [8];
  ostringstream os;
  GLenum internalformat_local;
  int stage_local;
  int target_local;
  AtomicMachine *this_local;
  
  os._372_4_ = internalformat;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  std::operator<<((ostream *)local_1a0,"\n#define KSIZE 100");
  if (stage == 4) {
    std::operator<<((ostream *)local_1a0,"\nlayout(local_size_x = KSIZE) in;");
  }
  switch(target) {
  case 0:
    poVar1 = std::operator<<((ostream *)local_1a0,"\nlayout(");
    glcts::(anonymous_namespace)::ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
              (&local_1d0,(ShaderImageLoadStoreBase *)this,os._372_4_);
    poVar1 = std::operator<<(poVar1,(string *)&local_1d0);
    poVar1 = std::operator<<(poVar1,", binding = 1) coherent uniform ");
    ShaderImageLoadStoreBase::TypePrefix<unsigned_int>
              (&local_1f0,&this->super_ShaderImageLoadStoreBase);
    poVar1 = std::operator<<(poVar1,(string *)&local_1f0);
    std::operator<<(poVar1,"image2D g_image_2d;");
    std::__cxx11::string::~string((string *)&local_1f0);
    std::__cxx11::string::~string((string *)&local_1d0);
    break;
  case 1:
    poVar1 = std::operator<<((ostream *)local_1a0,"\nlayout(");
    glcts::(anonymous_namespace)::ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
              (&local_210,(ShaderImageLoadStoreBase *)this,os._372_4_);
    poVar1 = std::operator<<(poVar1,(string *)&local_210);
    poVar1 = std::operator<<(poVar1,", binding = 2) coherent uniform ");
    ShaderImageLoadStoreBase::TypePrefix<unsigned_int>
              (&local_230,&this->super_ShaderImageLoadStoreBase);
    poVar1 = std::operator<<(poVar1,(string *)&local_230);
    std::operator<<(poVar1,"image3D g_image_3d;");
    std::__cxx11::string::~string((string *)&local_230);
    std::__cxx11::string::~string((string *)&local_210);
    break;
  case 2:
    poVar1 = std::operator<<((ostream *)local_1a0,"\nlayout(");
    glcts::(anonymous_namespace)::ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
              (&local_250,(ShaderImageLoadStoreBase *)this,os._372_4_);
    poVar1 = std::operator<<(poVar1,(string *)&local_250);
    poVar1 = std::operator<<(poVar1,", binding = 0) coherent uniform ");
    ShaderImageLoadStoreBase::TypePrefix<unsigned_int>
              (&local_270,&this->super_ShaderImageLoadStoreBase);
    poVar1 = std::operator<<(poVar1,(string *)&local_270);
    std::operator<<(poVar1,"imageCube g_image_cube;");
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)&local_250);
    break;
  case 3:
    poVar1 = std::operator<<((ostream *)local_1a0,"\nlayout(");
    glcts::(anonymous_namespace)::ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
              (&local_290,(ShaderImageLoadStoreBase *)this,os._372_4_);
    poVar1 = std::operator<<(poVar1,(string *)&local_290);
    poVar1 = std::operator<<(poVar1,", binding = 3) coherent uniform ");
    ShaderImageLoadStoreBase::TypePrefix<unsigned_int>
              (&local_2b0,&this->super_ShaderImageLoadStoreBase);
    poVar1 = std::operator<<(poVar1,(string *)&local_2b0);
    std::operator<<(poVar1,"image2DArray g_image_2darray;");
    std::__cxx11::string::~string((string *)&local_2b0);
    std::__cxx11::string::~string((string *)&local_290);
  }
  poVar1 = std::operator<<((ostream *)local_1a0,
                           "\nlayout(std430) buffer out_data {\n  ivec4 o_color[KSIZE];\n} r;\n");
  ShaderImageLoadStoreBase::TypePrefix<unsigned_int>
            (&local_2d0,&this->super_ShaderImageLoadStoreBase);
  poVar1 = std::operator<<(poVar1,(string *)&local_2d0);
  poVar1 = std::operator<<(poVar1,"vec2 t(int i) {\n  return ");
  ShaderImageLoadStoreBase::TypePrefix<unsigned_int>
            (&local_2f0,&this->super_ShaderImageLoadStoreBase);
  poVar1 = std::operator<<(poVar1,(string *)&local_2f0);
  std::operator<<(poVar1,
                  "vec2(i);\n}\nvoid main() {\n  int g_value[6] = int[](r.o_color[0].x, r.o_color[0].y+1, r.o_color[0].z+2, r.o_color[0].w+3, r.o_color[1].r+4, r.o_color[1].g+5);"
                 );
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__cxx11::string::~string((string *)&local_2d0);
  if (stage == 0) {
    std::operator<<((ostream *)local_1a0,"\n  ivec2 coord = ivec2(gl_VertexID, g_value[0]);");
  }
  else if (stage == 4) {
    std::operator<<((ostream *)local_1a0,
                    "\n  ivec2 coord = ivec2(gl_GlobalInvocationID.x, g_value[0]);");
  }
  std::operator<<((ostream *)local_1a0,"\n  ivec4 o_color = ivec4(0, 1, 0, 1);");
  switch(target) {
  case 0:
    std::operator<<((ostream *)local_1a0,
                    "\n  ivec4 i = ivec4(1, 0, 0, 2);\n  imageAtomicExchange(g_image_2d, coord, t(0).x);\n  if (imageAtomicAdd(g_image_2d, coord, t(2).x) != t(0).x) o_color = i;\n  if (imageAtomicMin(g_image_2d, coord, t(3).x) != t(2).x) o_color = i;\n  if (imageAtomicMax(g_image_2d, coord, t(4).x) != t(2).x) o_color = i;\n  if (imageAtomicAnd(g_image_2d, coord, t(0).x) != t(4).x) o_color = i;\n  if (imageAtomicOr(g_image_2d, coord, t(7).x) != t(0).x) o_color = i;\n  if (imageAtomicXor(g_image_2d, coord, t(4).x) != t(7).x) o_color = i;\n  if (imageAtomicExchange(g_image_2d, coord, t(1).x) != t(3).x) o_color = i;\n  if (imageAtomicCompSwap(g_image_2d, coord, t(1).x, t(6).x) != t(1).x) o_color = i;\n  if (imageAtomicExchange(g_image_2d, coord, t(0).x) != t(6).x) o_color = i;"
                   );
    break;
  case 1:
    std::operator<<((ostream *)local_1a0,
                    "\n  ivec4 i = ivec4(1, 0, 0, 3);\n  imageAtomicExchange(g_image_3d, ivec3(coord, 0), t(0).x);\n  if (imageAtomicAdd(g_image_3d, ivec3(coord, 0), t(2).x) != t(0).x) o_color = i;\n  if (imageAtomicMin(g_image_3d, ivec3(coord, 0), t(3).x) != t(2).x) o_color = i;\n  if (imageAtomicMax(g_image_3d, ivec3(coord, g_value[0]), t(4).x) != t(2).x) o_color = i;\n  if (imageAtomicAnd(g_image_3d, ivec3(coord, 0), t(0).x) != t(4).x) o_color = i;\n  if (imageAtomicOr(g_image_3d, ivec3(coord, 0), t(7).x) != t(0).x) o_color = i;\n  if (imageAtomicXor(g_image_3d, ivec3(coord, 0), t(4).x) != t(7).x) o_color = i;\n  if (imageAtomicExchange(g_image_3d, ivec3(coord, 0), t(1).x) != t(3).x) o_color = i;\n  if (imageAtomicCompSwap(g_image_3d, ivec3(coord, 0), t(1).x, t(6).x) != t(1).x) o_color = i;\n  if (imageAtomicExchange(g_image_3d, ivec3(coord, 0), t(0).x) != t(6).x) o_color = i;"
                   );
    break;
  case 2:
    std::operator<<((ostream *)local_1a0,
                    "\n  ivec4 i = ivec4(1, 0, 0, 6);\n  imageAtomicExchange(g_image_cube, ivec3(coord, 0), t(0).x);\n  if (imageAtomicAdd(g_image_cube, ivec3(coord, 0), t(g_value[2]).x) != t(0).x) o_color = i;\n  if (imageAtomicMin(g_image_cube, ivec3(coord, 0), t(3).x) != t(2).x) o_color = i;\n  if (imageAtomicMax(g_image_cube, ivec3(coord, 0), t(4).x) != t(2).x) o_color = i;\n  if (imageAtomicAnd(g_image_cube, ivec3(coord, 0), t(0).x) != t(4).x) o_color = i;\n  if (imageAtomicOr(g_image_cube, ivec3(coord, 0), t(7).x) != t(0).x) o_color = i;\n  if (imageAtomicXor(g_image_cube, ivec3(coord, 0), t(4).x) != t(7).x) o_color = i;\n  if (imageAtomicExchange(g_image_cube, ivec3(coord, 0), t(1).x) != t(3).x) o_color = i;\n  if (imageAtomicCompSwap(g_image_cube, ivec3(coord, g_value[0]), t(1).x, t(6).x) != t(1).x) o_color = i;\n  if (imageAtomicExchange(g_image_cube, ivec3(coord, 0), t(0).x) != t(6).x) o_color = i;"
                   );
    break;
  case 3:
    std::operator<<((ostream *)local_1a0,
                    "\n  ivec4 i = ivec4(1, 0, 0, 23);\n  imageAtomicExchange(g_image_2darray, ivec3(coord, 0), t(0).x);\n  if (imageAtomicAdd(g_image_2darray, ivec3(coord, 0), t(2).x) != t(0).x) o_color = i;\n  if (imageAtomicMin(g_image_2darray, ivec3(coord, 0), t(3).x) != t(2).x) o_color = i;\n  if (imageAtomicMax(g_image_2darray, ivec3(coord, 0), t(4).x) != t(2).x) o_color = i;\n  if (imageAtomicAnd(g_image_2darray, ivec3(coord, 0), t(0).x) != t(4).x) o_color = i;\n  if (imageAtomicOr(g_image_2darray, ivec3(coord, 0), t(7).x) != t(0).x) o_color = i;\n  if (imageAtomicXor(g_image_2darray, ivec3(coord, 0), t(g_value[4]).x) != t(7).x) o_color = i;\n  if (imageAtomicExchange(g_image_2darray, ivec3(coord, 0), t(1).x) != t(3).x) o_color = i;\n  if (imageAtomicCompSwap(g_image_2darray, ivec3(coord, 0), t(1).x, t(6).x) != t(1).x) o_color = i;\n  if (imageAtomicExchange(g_image_2darray, ivec3(coord, 0), t(0).x) != t(6).x) o_color = i;"
                   );
  }
  std::operator<<((ostream *)local_1a0,"\n  r.o_color[coord.x] = o_color;\n}");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string GenShader(int target, int stage, GLenum internalformat)
	{
		std::ostringstream os;
		os << NL "#define KSIZE 100";
		if (stage == 4)
		{ // CS
			os << NL "layout(local_size_x = KSIZE) in;";
		}
		switch (target)
		{
		case T2D:
			os << NL "layout(" << FormatEnumToString(internalformat) << ", binding = 1) coherent uniform "
			   << TypePrefix<T>() << "image2D g_image_2d;";
			break;
		case T3D:
			os << NL "layout(" << FormatEnumToString(internalformat) << ", binding = 2) coherent uniform "
			   << TypePrefix<T>() << "image3D g_image_3d;";
			break;
		case TCM:
			os << NL "layout(" << FormatEnumToString(internalformat) << ", binding = 0) coherent uniform "
			   << TypePrefix<T>() << "imageCube g_image_cube;";
			break;
		case T2DA:
			os << NL "layout(" << FormatEnumToString(internalformat) << ", binding = 3) coherent uniform "
			   << TypePrefix<T>() << "image2DArray g_image_2darray;";
			break;
		}
		os << NL "layout(std430) buffer out_data {" NL "  ivec4 o_color[KSIZE];" NL "} r;" NL << TypePrefix<T>()
		   << "vec2 t(int i) {" NL "  return " << TypePrefix<T>()
		   << "vec2(i);" NL "}" NL "void main() {" NL "  int g_value[6] = int[](r.o_color[0].x, r.o_color[0].y+1, "
			  "r.o_color[0].z+2, r.o_color[0].w+3, r.o_color[1].r+4, "
			  "r.o_color[1].g+5);";
		if (stage == 0)
		{ // VS
			os << NL "  ivec2 coord = ivec2(gl_VertexID, g_value[0]);";
		}
		else if (stage == 4)
		{ // CS
			os << NL "  ivec2 coord = ivec2(gl_GlobalInvocationID.x, g_value[0]);";
		}
		os << NL "  ivec4 o_color = ivec4(0, 1, 0, 1);";
		switch (target)
		{
		case T2D:
			os << NL "  ivec4 i = ivec4(1, 0, 0, 2);" NL "  imageAtomicExchange(g_image_2d, coord, t(0).x);" NL
					 "  if (imageAtomicAdd(g_image_2d, coord, t(2).x) != t(0).x) o_color = i;" NL
					 "  if (imageAtomicMin(g_image_2d, coord, t(3).x) != t(2).x) o_color = i;" NL
					 "  if (imageAtomicMax(g_image_2d, coord, t(4).x) != t(2).x) o_color = i;" NL
					 "  if (imageAtomicAnd(g_image_2d, coord, t(0).x) != t(4).x) o_color = i;" NL
					 "  if (imageAtomicOr(g_image_2d, coord, t(7).x) != t(0).x) o_color = i;" NL
					 "  if (imageAtomicXor(g_image_2d, coord, t(4).x) != t(7).x) o_color = i;" NL
					 "  if (imageAtomicExchange(g_image_2d, coord, t(1).x) != t(3).x) o_color = i;" NL
					 "  if (imageAtomicCompSwap(g_image_2d, coord, t(1).x, t(6).x) != t(1).x) o_color = i;" NL
					 "  if (imageAtomicExchange(g_image_2d, coord, t(0).x) != t(6).x) o_color = i;";
			break;
		case T3D:
			os << NL "  ivec4 i = ivec4(1, 0, 0, 3);" NL
					 "  imageAtomicExchange(g_image_3d, ivec3(coord, 0), t(0).x);" NL
					 "  if (imageAtomicAdd(g_image_3d, ivec3(coord, 0), t(2).x) != t(0).x) o_color = i;" NL
					 "  if (imageAtomicMin(g_image_3d, ivec3(coord, 0), t(3).x) != t(2).x) o_color = i;" NL
					 "  if (imageAtomicMax(g_image_3d, ivec3(coord, g_value[0]), t(4).x) != t(2).x) o_color = i;" NL
					 "  if (imageAtomicAnd(g_image_3d, ivec3(coord, 0), t(0).x) != t(4).x) o_color = i;" NL
					 "  if (imageAtomicOr(g_image_3d, ivec3(coord, 0), t(7).x) != t(0).x) o_color = i;" NL
					 "  if (imageAtomicXor(g_image_3d, ivec3(coord, 0), t(4).x) != t(7).x) o_color = i;" NL
					 "  if (imageAtomicExchange(g_image_3d, ivec3(coord, 0), t(1).x) != t(3).x) o_color = i;" NL
					 "  if (imageAtomicCompSwap(g_image_3d, ivec3(coord, 0), t(1).x, t(6).x) != t(1).x) o_color = i;" NL
					 "  if (imageAtomicExchange(g_image_3d, ivec3(coord, 0), t(0).x) != t(6).x) o_color = i;";
			break;
		case TCM:
			os << NL
				"  ivec4 i = ivec4(1, 0, 0, 6);" NL "  imageAtomicExchange(g_image_cube, ivec3(coord, 0), t(0).x);" NL
				"  if (imageAtomicAdd(g_image_cube, ivec3(coord, 0), t(g_value[2]).x) != t(0).x) o_color = i;" NL
				"  if (imageAtomicMin(g_image_cube, ivec3(coord, 0), t(3).x) != t(2).x) o_color = i;" NL
				"  if (imageAtomicMax(g_image_cube, ivec3(coord, 0), t(4).x) != t(2).x) o_color = i;" NL
				"  if (imageAtomicAnd(g_image_cube, ivec3(coord, 0), t(0).x) != t(4).x) o_color = i;" NL
				"  if (imageAtomicOr(g_image_cube, ivec3(coord, 0), t(7).x) != t(0).x) o_color = i;" NL
				"  if (imageAtomicXor(g_image_cube, ivec3(coord, 0), t(4).x) != t(7).x) o_color = i;" NL
				"  if (imageAtomicExchange(g_image_cube, ivec3(coord, 0), t(1).x) != t(3).x) o_color = i;" NL
				"  if (imageAtomicCompSwap(g_image_cube, ivec3(coord, g_value[0]), t(1).x, t(6).x) != t(1).x) o_color "
				"= i;" NL "  if (imageAtomicExchange(g_image_cube, ivec3(coord, 0), t(0).x) != t(6).x) o_color = i;";
			break;
		case T2DA:
			os << NL
				"  ivec4 i = ivec4(1, 0, 0, 23);" NL
				"  imageAtomicExchange(g_image_2darray, ivec3(coord, 0), t(0).x);" NL
				"  if (imageAtomicAdd(g_image_2darray, ivec3(coord, 0), t(2).x) != t(0).x) o_color = i;" NL
				"  if (imageAtomicMin(g_image_2darray, ivec3(coord, 0), t(3).x) != t(2).x) o_color = i;" NL
				"  if (imageAtomicMax(g_image_2darray, ivec3(coord, 0), t(4).x) != t(2).x) o_color = i;" NL
				"  if (imageAtomicAnd(g_image_2darray, ivec3(coord, 0), t(0).x) != t(4).x) o_color = i;" NL
				"  if (imageAtomicOr(g_image_2darray, ivec3(coord, 0), t(7).x) != t(0).x) o_color = i;" NL
				"  if (imageAtomicXor(g_image_2darray, ivec3(coord, 0), t(g_value[4]).x) != t(7).x) o_color = i;" NL
				"  if (imageAtomicExchange(g_image_2darray, ivec3(coord, 0), t(1).x) != t(3).x) o_color = i;" NL
				"  if (imageAtomicCompSwap(g_image_2darray, ivec3(coord, 0), t(1).x, t(6).x) != t(1).x) o_color = i;" NL
				"  if (imageAtomicExchange(g_image_2darray, ivec3(coord, 0), t(0).x) != t(6).x) o_color = i;";
			break;
		}
		os << NL "  r.o_color[coord.x] = o_color;" NL "}";
		return os.str();
	}